

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

string * __thiscall
compiler::AssemblerCompiler::do_conditional_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Conditional *conditional)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  socklen_t *in_RCX;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_type *psVar11;
  char cVar12;
  ulong uVar13;
  string __str;
  string __str_1;
  ulong *local_2d0;
  uint local_2c8;
  undefined4 uStack_2c4;
  ulong local_2c0 [2];
  ulong *local_2b0;
  uint local_2a8;
  undefined4 uStack_2a4;
  ulong local_2a0 [2];
  ulong *local_290;
  uint local_288;
  undefined4 uStack_284;
  ulong local_280 [2];
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  undefined4 uStack_238;
  undefined4 uStack_234;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  uint local_208;
  undefined4 uStack_204;
  ulong local_200 [2];
  long *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  undefined8 uStack_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  Object local_50;
  _func_int *local_40 [2];
  
  uVar10 = this->label_counter_;
  this->label_counter_ = uVar10 + 2;
  Var::accept_abi_cxx11_((Var *)&local_50,(int)conditional->expression,(sockaddr *)this,in_RCX);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1061f9);
  local_90 = &local_80;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_260 = *puVar7;
    lStack_258 = plVar4[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar7;
    local_270 = (ulong *)*plVar4;
  }
  local_268 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar12 = '\x01';
  if (9 < uVar10) {
    uVar8 = uVar10;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar8 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00104813;
      }
      if (uVar8 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00104813;
      }
      if (uVar8 < 10000) goto LAB_00104813;
      bVar1 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar1);
    cVar12 = cVar12 + '\x01';
  }
LAB_00104813:
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_290,local_288,uVar10);
  uVar8 = CONCAT44(uStack_284,local_288) + local_268;
  uVar9 = 0xf;
  if (local_270 != &local_260) {
    uVar9 = local_260;
  }
  if (uVar9 < uVar8) {
    uVar9 = 0xf;
    if (local_290 != local_280) {
      uVar9 = local_280[0];
    }
    if (uVar9 < uVar8) goto LAB_00104878;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_270);
  }
  else {
LAB_00104878:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_290);
  }
  local_1f0 = &local_1e0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1e0 = *plVar4;
    uStack_1d8 = puVar5[3];
  }
  else {
    local_1e0 = *plVar4;
    local_1f0 = (long *)*puVar5;
  }
  local_1e8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_240 = *puVar7;
    uStack_238 = (undefined4)plVar4[3];
    uStack_234 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar7;
    local_250 = (ulong *)*plVar4;
  }
  local_248 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  (**(conditional->right->super_Object)._vptr_Object)(&local_b0,conditional->right,this);
  uVar8 = 0xf;
  if (local_250 != &local_240) {
    uVar8 = local_240;
  }
  if (uVar8 < (ulong)(local_a8 + local_248)) {
    uVar8 = 0xf;
    if (local_b0 != local_a0) {
      uVar8 = local_a0[0];
    }
    if (uVar8 < (ulong)(local_a8 + local_248)) goto LAB_001049b8;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_250);
  }
  else {
LAB_001049b8:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_b0);
  }
  local_1d0 = &local_1c0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1c0 = *plVar4;
    uStack_1b8 = puVar5[3];
  }
  else {
    local_1c0 = *plVar4;
    local_1d0 = (long *)*puVar5;
  }
  local_1c8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  uVar8 = uVar10 + 1;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_220 = *puVar7;
    lStack_218 = plVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar7;
    local_230 = (ulong *)*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar12 = '\x01';
  if (9 < uVar8) {
    uVar9 = uVar8;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00104af8;
      }
      if (uVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00104af8;
      }
      if (uVar9 < 10000) goto LAB_00104af8;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar1);
    cVar12 = cVar12 + '\x01';
  }
LAB_00104af8:
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b0,local_2a8,uVar8);
  uVar9 = CONCAT44(uStack_2a4,local_2a8) + local_228;
  uVar13 = 0xf;
  if (local_230 != &local_220) {
    uVar13 = local_220;
  }
  if (uVar13 < uVar9) {
    uVar13 = 0xf;
    if (local_2b0 != local_2a0) {
      uVar13 = local_2a0[0];
    }
    if (uVar13 < uVar9) goto LAB_00104b6b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_230);
  }
  else {
LAB_00104b6b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_2b0);
  }
  local_1b0 = &local_1a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1a0 = *plVar4;
    uStack_198 = puVar5[3];
  }
  else {
    local_1a0 = *plVar4;
    local_1b0 = (long *)*puVar5;
  }
  local_1a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_70 = &local_60;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_120 = *puVar7;
    lStack_118 = plVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar7;
    local_130 = (ulong *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar12 = '\x01';
  if (9 < uVar10) {
    uVar9 = uVar10;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00104d01;
      }
      if (uVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00104d01;
      }
      if (uVar9 < 10000) goto LAB_00104d01;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar1);
    cVar12 = cVar12 + '\x01';
  }
LAB_00104d01:
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2d0,local_2c8,uVar10);
  uVar10 = CONCAT44(uStack_2c4,local_2c8) + local_128;
  uVar9 = 0xf;
  if (local_130 != &local_120) {
    uVar9 = local_120;
  }
  if (uVar9 < uVar10) {
    uVar9 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar9 = local_2c0[0];
    }
    if (uVar9 < uVar10) goto LAB_00104d74;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00104d74:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_2d0);
  }
  local_190 = &local_180;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_180 = *plVar4;
    uStack_178 = puVar5[3];
  }
  else {
    local_180 = *plVar4;
    local_190 = (long *)*puVar5;
  }
  local_188 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_100 = *puVar7;
    uStack_f8 = (undefined4)plVar4[3];
    uStack_f4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar7;
    local_110 = (ulong *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  (**(conditional->left->super_Object)._vptr_Object)(&local_d0,conditional->left,this);
  uVar10 = 0xf;
  if (local_110 != &local_100) {
    uVar10 = local_100;
  }
  if (uVar10 < (ulong)(local_c8 + local_108)) {
    uVar10 = 0xf;
    if (local_d0 != local_c0) {
      uVar10 = local_c0[0];
    }
    if (uVar10 < (ulong)(local_c8 + local_108)) goto LAB_00104eb8;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00104eb8:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_d0);
  }
  local_170 = &local_160;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_160 = *plVar4;
    uStack_158 = puVar5[3];
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*puVar5;
  }
  local_168 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_e0 = *puVar7;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar7;
    local_f0 = (ulong *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar12 = '\x01';
  if (9 < uVar8) {
    uVar10 = uVar8;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00104ff3;
      }
      if (uVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00104ff3;
      }
      if (uVar10 < 10000) goto LAB_00104ff3;
      bVar1 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar1);
    cVar12 = cVar12 + '\x01';
  }
LAB_00104ff3:
  local_210 = local_200;
  std::__cxx11::string::_M_construct((ulong)&local_210,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_210,local_208,uVar8);
  uVar10 = CONCAT44(uStack_204,local_208) + local_e8;
  uVar8 = 0xf;
  if (local_f0 != &local_e0) {
    uVar8 = local_e0;
  }
  if (uVar8 < uVar10) {
    uVar8 = 0xf;
    if (local_210 != local_200) {
      uVar8 = local_200[0];
    }
    if (uVar10 <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0010509e;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_210);
LAB_0010509e:
  local_150 = &local_140;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_140 = *plVar4;
    uStack_138 = puVar5[3];
  }
  else {
    local_140 = *plVar4;
    local_150 = (long *)*puVar5;
  }
  local_148 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar11) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50._vptr_Object != local_40) {
    operator_delete(local_50._vptr_Object,(ulong)(local_40[0] + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_conditional(const Conditional *conditional) {
    auto label_true = label_counter_++;
    auto label_false = label_counter_++;

    return "GOTOIF " + conditional->expression->accept(this) + ", " + std::to_string(label_true) + ";" +
           conditional->right->accept(this) +
           "GOTOIF 1, " + std::to_string(label_false) + ";" +
           "LABEL " + std::to_string(label_true) + ";" +
           conditional->left->accept(this) +
           "LABEL " + std::to_string(label_false) + ";";
}